

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

void prvTidyInitMap(void)

{
  long lVar1;
  byte bVar2;
  
  bVar2 = 0xd;
  lVar1 = 1;
  do {
    *(byte *)(lexmap + bVar2) = (byte)lexmap[bVar2] | 0x18;
    bVar2 = "\r\n\f"[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  bVar2 = 0x20;
  lVar1 = 0;
  do {
    *(byte *)(lexmap + bVar2) = (byte)lexmap[bVar2] | 8;
    bVar2 = " \t"[lVar1 + 1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 2);
  bVar2 = 0x2d;
  lVar1 = 0;
  do {
    *(byte *)(lexmap + bVar2) = (byte)lexmap[bVar2] | 4;
    bVar2 = "-.:_"[lVar1 + 1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  bVar2 = 0x30;
  lVar1 = 1;
  do {
    *(byte *)(lexmap + bVar2) = (byte)lexmap[bVar2] | 0x85;
    bVar2 = "0123456789"[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xb);
  bVar2 = 0x61;
  lVar1 = 1;
  do {
    *(byte *)(lexmap + bVar2) = (byte)lexmap[bVar2] | 0x26;
    bVar2 = "abcdefghijklmnopqrstuvwxyz"[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x1b);
  bVar2 = 0x41;
  lVar1 = 1;
  do {
    *(byte *)(lexmap + bVar2) = (byte)lexmap[bVar2] | 0x46;
    bVar2 = "ABCDEFGHIJKLMNOPQRSTUVWXYZ"[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x1b);
  bVar2 = 0x61;
  lVar1 = 1;
  do {
    *(byte *)(lexmap + bVar2) = (byte)lexmap[bVar2] | 0x80;
    bVar2 = "abcdefABCDEF"[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xd);
  return;
}

Assistant:

void TY_(InitMap)(void)
{
    MapStr("\r\n\f", newline|white);
    MapStr(" \t", white);
    MapStr("-.:_", namechar);
    MapStr("0123456789", digit|digithex|namechar);
    MapStr("abcdefghijklmnopqrstuvwxyz", lowercase|letter|namechar);
    MapStr("ABCDEFGHIJKLMNOPQRSTUVWXYZ", uppercase|letter|namechar);
    MapStr("abcdefABCDEF", digithex);
}